

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderMBlurSAHGrid<8>::buildMultiSegment
          (BVHNBuilderMBlurSAHGrid<8> *this,size_t numPrimitives)

{
  SubGridBuildData *pSVar1;
  long lVar2;
  float fVar3;
  long lVar4;
  Scene *pSVar5;
  size_t sVar6;
  ulong uVar7;
  mvector<PrimRefMB> local_1a8;
  Scene *local_180;
  BVH *pBStack_178;
  SubGridBuildData *local_170;
  undefined8 local_168;
  undefined8 local_160;
  long local_158;
  ulong local_150;
  ulong local_148;
  undefined4 local_140;
  float local_13c;
  undefined1 local_138;
  size_t local_130;
  undefined **local_128;
  Scene *local_120;
  PrimInfoMB pinfo;
  BVHNodeRecordMB4D<embree::NodeRefPtr<8>_> root;
  
  pSVar5 = this->scene;
  lVar4 = *(long *)&(pSVar5->super_AccelN).field_0x188;
  local_1a8.alloc.device = (MemoryMonitorInterface *)(lVar4 + 0x550);
  if (lVar4 == 0) {
    local_1a8.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_1a8.alloc.hugepages = false;
  local_1a8.items = (PrimRefMB *)0x0;
  local_1a8.size_active = 0;
  local_1a8.size_alloced = 0;
  if (numPrimitives != 0) {
    uVar7 = numPrimitives * 0x50;
    (**(local_1a8.alloc.device)->_vptr_MemoryMonitorInterface)(local_1a8.alloc.device,uVar7,0);
    if (uVar7 < 0x1c00000) {
      local_1a8.items = (PrimRefMB *)alignedMalloc(uVar7,0x10);
    }
    else {
      local_1a8.items = (PrimRefMB *)os_malloc(uVar7,&local_1a8.alloc.hugepages);
    }
    pSVar5 = this->scene;
    local_1a8.size_alloced = numPrimitives;
  }
  local_1a8.size_active = local_1a8.size_alloced;
  createPrimRefArrayMSMBlurGrid
            (&pinfo,this,pSVar5,&local_1a8,
             &(this->bvh->scene->progressInterface).super_BuildProgressMonitor,
             (BBox1f)0x3f80000000000000);
  if (pinfo.object_range._end == pinfo.object_range._begin) {
    (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
  }
  else {
    pSVar5 = this->scene;
    pSVar1 = (this->sgrids).items;
    fVar3 = (float)numPrimitives * 1.2 * 0.125 * 144.0;
    uVar7 = (ulong)fVar3;
    sVar6 = (pinfo.num_time_segments * 0x1c0 >> 5) +
            ((long)(fVar3 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7);
    FastAllocator::init_estimate(&this->bvh->alloc,sVar6);
    local_168 = 8;
    local_160 = 0x50;
    local_158 = 0x3f;
    if (this->sahBlockSize != 0) {
      for (; this->sahBlockSize >> local_158 == 0; local_158 = local_158 + -1) {
      }
    }
    local_148 = this->maxLeafSize;
    local_150 = this->minLeafSize;
    if (local_148 <= this->minLeafSize) {
      local_150 = local_148;
    }
    local_140 = 0x3f800000;
    local_13c = this->intCost;
    local_138 = 0;
    local_130 = FastAllocator::fixSingleThreadThreshold
                          (&this->bvh->alloc,8,0x400,
                           pinfo.object_range._end - pinfo.object_range._begin,sVar6);
    local_180 = this->scene;
    lVar2 = *(long *)&(local_180->super_AccelN).field_0x188;
    lVar4 = lVar2 + 0x550;
    if (lVar2 == 0) {
      lVar4 = 0;
    }
    pBStack_178 = this->bvh;
    local_170 = (this->sgrids).items;
    local_128 = &PTR_operator___021d4948;
    local_120 = (pBStack_178->scene->progressInterface).scene;
    BVHBuilderMSMBlur::
    build<embree::NodeRefPtr<8>,embree::avx::GridRecalculatePrimRef,embree::BVHN<8>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Set,embree::avx::CreateMSMBlurLeafGrid<8>,embree::Scene::BuildProgressMonitorInterface>
              (&root,(BVHBuilderMSMBlur *)&local_1a8,&pinfo,lVar4,pSVar5,pSVar1,&pBStack_178->alloc,
               local_180,pBStack_178,local_170,&local_128,&local_168);
    BVHN<8>::set(this->bvh,(NodeRef)root.ref.ptr,&root.lbounds,pinfo.num_time_segments);
  }
  sVar6 = local_1a8.size_alloced;
  if (local_1a8.items != (PrimRefMB *)0x0) {
    if (local_1a8.size_alloced * 0x50 < 0x1c00000) {
      alignedFree(local_1a8.items);
    }
    else {
      os_free(local_1a8.items,local_1a8.size_alloced * 0x50,local_1a8.alloc.hugepages);
    }
  }
  if (sVar6 != 0) {
    (**(local_1a8.alloc.device)->_vptr_MemoryMonitorInterface)
              (local_1a8.alloc.device,sVar6 * -0x50,1);
  }
  return;
}

Assistant:

void buildMultiSegment(size_t numPrimitives)
      {
        /* create primref array */
        mvector<PrimRefMB> prims(scene->device,numPrimitives);
        PrimInfoMB pinfo = createPrimRefArrayMSMBlurGrid(scene,prims,bvh->scene->progressInterface);

        /* early out if no valid primitives */
        if (pinfo.size() == 0) { bvh->clear(); return; }



        GridRecalculatePrimRef recalculatePrimRef(scene,sgrids.data());

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.num_time_segments*sizeof(AABBNodeMB)/(4*N);
        //FIXME: check leaf_bytes
        //const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.num_time_segments)*sizeof(SubGridQBVHN<N>));
        const size_t leaf_bytes = size_t(1.2*(float)numPrimitives/N * sizeof(SubGridQBVHN<N>));

        bvh->alloc.init_estimate(node_bytes+leaf_bytes);

        /* settings for BVH build */
        BVHBuilderMSMBlur::Settings settings;
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxDepth;
        settings.logBlockSize = bsr(sahBlockSize);
        settings.minLeafSize = min(minLeafSize,maxLeafSize);
        settings.maxLeafSize = maxLeafSize;
        settings.travCost = travCost;
        settings.intCost = intCost;
        settings.singleLeafTimeSegment = false; 
        settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);
        
        /* build hierarchy */
        auto root =
          BVHBuilderMSMBlur::build<NodeRef>(prims,pinfo,scene->device,
                                            recalculatePrimRef,
                                            typename BVH::CreateAlloc(bvh),
                                            typename BVH::AABBNodeMB4D::Create(),
                                            typename BVH::AABBNodeMB4D::Set(),
                                            CreateMSMBlurLeafGrid<N>(scene,bvh,sgrids.data()),
                                            bvh->scene->progressInterface,
                                            settings);
        bvh->set(root.ref,root.lbounds,pinfo.num_time_segments);
      }